

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IRBuilder.cpp
# Opt level: O0

void __thiscall IRBuilder::BuildReg2Aux(IRBuilder *this,OpCode newOpcode,uint32 offset)

{
  RegSlot dstRegSlot_00;
  code *pcVar1;
  bool bVar2;
  uint sourceContextId;
  uint functionId;
  OpLayoutReg2Aux *pOVar3;
  RegOpnd *src1Opnd_00;
  AddrOpnd *src2Opnd_00;
  RegOpnd *dstOpnd_00;
  Instr *instr_00;
  undefined4 *puVar4;
  RegSlot srcRegSlot;
  RegSlot dstRegSlot;
  Opnd *src2Opnd;
  RegOpnd *src1Opnd;
  RegOpnd *dstOpnd;
  Instr *instr;
  OpLayoutReg2Aux *auxInsn;
  uint32 offset_local;
  OpCode newOpcode_local;
  IRBuilder *this_local;
  
  bVar2 = OpCodeAttr::HasMultiSizeLayout(newOpcode);
  if (bVar2) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IRBuilder.cpp"
                       ,0x15bc,"(!OpCodeAttr::HasMultiSizeLayout(newOpcode))",
                       "!OpCodeAttr::HasMultiSizeLayout(newOpcode)");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  pOVar3 = Js::ByteCodeReader::Reg2Aux(&this->m_jnReader);
  sourceContextId = Func::GetSourceContextId(this->m_func);
  functionId = Func::GetLocalFunctionId(this->m_func);
  bVar2 = Js::Phases::IsEnabled
                    ((Phases *)&DAT_01eafdf0,ClosureRegCheckPhase,sourceContextId,functionId);
  if (!bVar2) {
    DoClosureRegCheck(this,(pOVar3->super_OpLayoutAuxiliary).R0);
    DoClosureRegCheck(this,pOVar3->R1);
  }
  if (newOpcode != SpreadArrayLiteral) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IRBuilder.cpp"
                       ,0x15e4,"((0))","Unknown Reg2Aux opcode");
    if (bVar2) {
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar4 = 0;
      Js::Throw::FatalInternalError(-0x7fffbffb);
    }
    pcVar1 = (code *)invalidInstructionException();
    (*pcVar1)();
  }
  dstRegSlot_00 = (pOVar3->super_OpLayoutAuxiliary).R0;
  src1Opnd_00 = BuildSrcOpnd(this,pOVar3->R1,TyVar);
  src2Opnd_00 = BuildAuxArrayOpnd(this,AuxIntArray,
                                  (pOVar3->super_OpLayoutAuxiliary).super_OpLayoutAuxNoReg.Offset);
  dstOpnd_00 = BuildDstOpnd(this,dstRegSlot_00,TyVar,false,false);
  instr_00 = IR::Instr::New(SpreadArrayLiteral,&dstOpnd_00->super_Opnd,&src1Opnd_00->super_Opnd,
                            &src2Opnd_00->super_Opnd,this->m_func);
  AddInstr(this,instr_00,0xffffffff);
  if ((*(uint *)&dstOpnd_00->m_sym->field_0x18 & 1) != 0) {
    *(uint *)&dstOpnd_00->m_sym->field_0x18 =
         *(uint *)&dstOpnd_00->m_sym->field_0x18 & 0xfffffffd | 2;
  }
  return;
}

Assistant:

void
IRBuilder::BuildReg2Aux(Js::OpCode newOpcode, uint32 offset)
{
    Assert(!OpCodeAttr::HasMultiSizeLayout(newOpcode));

    const unaligned Js::OpLayoutReg2Aux *auxInsn = m_jnReader.Reg2Aux();

    if (!PHASE_OFF(Js::ClosureRegCheckPhase, m_func))
    {
        this->DoClosureRegCheck(auxInsn->R0);
        this->DoClosureRegCheck(auxInsn->R1);
    }

    IR::Instr *instr;

    switch (newOpcode)
    {
    case Js::OpCode::SpreadArrayLiteral:
        {
            IR::RegOpnd *   dstOpnd;
            IR::RegOpnd *   src1Opnd;
            IR::Opnd*       src2Opnd;

            Js::RegSlot     dstRegSlot = auxInsn->R0;
            Js::RegSlot     srcRegSlot = auxInsn->R1;

            src1Opnd = this->BuildSrcOpnd(srcRegSlot);

            src2Opnd = this->BuildAuxArrayOpnd(AuxArrayValue::AuxIntArray, auxInsn->Offset);
            dstOpnd = this->BuildDstOpnd(dstRegSlot);

            instr = IR::Instr::New(Js::OpCode::SpreadArrayLiteral, dstOpnd, src1Opnd, src2Opnd, m_func);
            this->AddInstr(instr, Js::Constants::NoByteCodeOffset);

            if (dstOpnd->m_sym->m_isSingleDef)
            {
                dstOpnd->m_sym->m_isNotNumber = true;
            }
            break;
        }

    default:
        {
            AssertMsg(UNREACHED, "Unknown Reg2Aux opcode");
            Fatal();
            break;
        }
    }
}